

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWO2
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort *puVar1;
  uint uVar2;
  ushort local_38;
  ushort local_36;
  uint local_34;
  uint16_t i;
  uint16_t numIndices;
  uint max_local;
  uint16_t *end_local;
  uint16_t **cursor_local;
  uint *faces_local;
  uint *verts_local;
  LWOImporter *this_local;
  
  local_34 = max;
  _i = end;
  end_local = (uint16_t *)cursor;
  cursor_local = (uint16_t **)faces;
  faces_local = verts;
  verts_local = (uint *)this;
  while( true ) {
    uVar2 = local_34;
    if (*(uint16_t **)end_local < _i) {
      local_34 = local_34 - 1;
    }
    if (*(uint16_t **)end_local >= _i || uVar2 == 0) break;
    puVar1 = *(ushort **)end_local;
    *(ushort **)end_local = puVar1 + 1;
    local_36 = *puVar1;
    ByteSwap::Swap2(&local_36);
    local_36 = local_36 & 0x3ff;
    *faces_local = (uint)local_36 + *faces_local;
    *(int *)cursor_local = *(int *)cursor_local + 1;
    for (local_38 = 0; local_38 < local_36; local_38 = local_38 + 1) {
      ReadVSizedIntLWO2(this,(uint8_t **)end_local);
    }
  }
  return;
}

Assistant:

void LWOImporter::CountVertsAndFacesLWO2(unsigned int& verts, unsigned int& faces,
    uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        numIndices &= 0x03FF;

        verts += numIndices;
        ++faces;

        for(uint16_t i = 0; i < numIndices; i++)
        {
            ReadVSizedIntLWO2((uint8_t*&)cursor);
        }
    }
}